

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec_helper.c
# Opt level: O2

void helper_gvec_fcmlah_arm(void *vd,void *vn,void *vm,void *vfpst,uint32_t desc)

{
  uint uVar1;
  ushort uVar2;
  float16 fVar3;
  float16 fVar4;
  ulong uVar5;
  ulong uVar6;
  uintptr_t i;
  ulong uVar7;
  ushort local_60;
  ushort local_5c;
  
  uVar1 = (desc & 0x1f) * 8 + 8;
  uVar7 = (ulong)uVar1;
  uVar5 = (ulong)(desc >> 9 & 2);
  for (uVar6 = 0; uVar6 < uVar1 >> 1; uVar6 = uVar6 + 2) {
    fVar4 = *(float16 *)((long)vn + uVar6 * 2 + uVar5);
    local_5c = (ushort)((desc >> 10 ^ desc >> 0xb) << 0xf);
    uVar2 = *(ushort *)((long)vm + uVar6 * 2 + (2 - uVar5));
    local_60 = (ushort)((desc >> 0xb) << 0xf);
    fVar3 = float16_muladd_arm(fVar4,*(ushort *)((long)vm + uVar6 * 2 + uVar5) ^ local_5c,
                               *(float16 *)((long)vd + uVar6 * 2),0,(float_status *)vfpst);
    *(float16 *)((long)vd + uVar6 * 2) = fVar3;
    fVar4 = float16_muladd_arm(fVar4,uVar2 ^ local_60,*(float16 *)((long)vd + uVar6 * 2 + 2),0,
                               (float_status *)vfpst);
    *(float16 *)((long)vd + uVar6 * 2 + 2) = fVar4;
  }
  for (; uVar7 < (desc >> 2 & 0xf8) + 8; uVar7 = uVar7 + 8) {
    *(undefined8 *)((long)vd + uVar7) = 0;
  }
  return;
}

Assistant:

void HELPER(gvec_fcmlah)(void *vd, void *vn, void *vm,
                         void *vfpst, uint32_t desc)
{
    uintptr_t opr_sz = simd_oprsz(desc);
    float16 *d = vd;
    float16 *n = vn;
    float16 *m = vm;
    float_status *fpst = vfpst;
    intptr_t flip = extract32(desc, SIMD_DATA_SHIFT, 1);
    uint32_t neg_imag = extract32(desc, SIMD_DATA_SHIFT + 1, 1);
    uint32_t neg_real = flip ^ neg_imag;
    uintptr_t i;

    /* Shift boolean to the sign bit so we can xor to negate.  */
    neg_real <<= 15;
    neg_imag <<= 15;

    for (i = 0; i < opr_sz / 2; i += 2) {
        float16 e2 = n[H2(i + flip)];
        float16 e1 = m[H2(i + flip)] ^ neg_real;
        float16 e4 = e2;
        float16 e3 = m[H2(i + 1 - flip)] ^ neg_imag;

        d[H2(i)] = float16_muladd(e2, e1, d[H2(i)], 0, fpst);
        d[H2(i + 1)] = float16_muladd(e4, e3, d[H2(i + 1)], 0, fpst);
    }
    clear_tail(d, opr_sz, simd_maxsz(desc));
}